

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<int,QByteArray>::emplace<QByteArray_const&>
          (QHash<int,_QByteArray> *this,int *key,QByteArray *args)

{
  long lVar1;
  bool bVar2;
  int *in_RSI;
  QHash<int,_QByteArray> *in_RDI;
  long in_FS_OFFSET;
  QHash<int,_QByteArray> copy;
  QByteArray *in_stack_ffffffffffffff88;
  QByteArray *in_stack_ffffffffffffff90;
  QByteArray *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  piter local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<int,_QByteArray>::isDetached((QHash<int,_QByteArray> *)in_stack_ffffffffffffff90);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::Node<int,_QByteArray>_>::shouldGrow(in_RDI->d);
    if (bVar2) {
      QByteArray::QByteArray(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_38 = (piter)QHash<int,_QByteArray>::emplace_helper<QByteArray>
                                  (in_RDI,in_RSI,in_stack_ffffffffffffff98);
      QByteArray::~QByteArray((QByteArray *)0x1538de);
    }
    else {
      local_38 = (piter)emplace_helper<QByteArray_const&>
                                  (in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  else {
    QHash<int,_QByteArray>::QHash
              ((QHash<int,_QByteArray> *)in_stack_ffffffffffffff90,
               (QHash<int,_QByteArray> *)in_stack_ffffffffffffff88);
    QHash<int,_QByteArray>::detach((QHash<int,_QByteArray> *)in_stack_ffffffffffffff90);
    local_38 = (piter)emplace_helper<QByteArray_const&>
                                (in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QHash<int,_QByteArray>::~QHash((QHash<int,_QByteArray> *)in_stack_ffffffffffffff90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)local_38;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }